

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O3

void __thiscall
t_haxe_generator::t_haxe_generator
          (t_haxe_generator *this,t_program *program,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *parsed_options,string *option_string)

{
  _Rb_tree_node_base *__rhs;
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  
  t_generator::t_generator((t_generator *)this,program);
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_haxe_generator_004100e8;
  (this->buildmacro_)._M_dataplus._M_p = (pointer)&(this->buildmacro_).field_2;
  (this->buildmacro_)._M_string_length = 0;
  (this->buildmacro_).field_2._M_local_buf[0] = '\0';
  (this->package_name_)._M_dataplus._M_p = (pointer)&(this->package_name_).field_2;
  (this->package_name_)._M_string_length = 0;
  (this->package_name_).field_2._M_local_buf[0] = '\0';
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_service_);
  (this->package_dir_)._M_dataplus._M_p = (pointer)&(this->package_dir_).field_2;
  (this->package_dir_)._M_string_length = 0;
  (this->package_dir_).field_2._M_local_buf[0] = '\0';
  this->rtti_ = false;
  std::__cxx11::string::_M_replace
            ((ulong)&this->buildmacro_,0,(char *)(this->buildmacro_)._M_string_length,0x378967);
  p_Var2 = (parsed_options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(parsed_options->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_t_oop_generator).super_t_generator.out_dir_base_,0,
                 (char *)(this->super_t_oop_generator).super_t_generator.out_dir_base_.
                         _M_string_length,0x38dc17);
      return;
    }
    __rhs = p_Var2 + 1;
    iVar1 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar1 == 0) {
      puts("Hint: The \'callbacks\' option is no longer necessary.");
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar1 == 0) {
        this->rtti_ = true;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar1 != 0) {
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
          std::operator+(__return_storage_ptr__,"unknown option haxe:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
        std::__cxx11::string::_M_assign((string *)&this->buildmacro_);
      }
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

t_haxe_generator(t_program* program,
                   const std::map<std::string, std::string>& parsed_options,
                   const std::string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    rtti_ = false;
    buildmacro_ = "";
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("callbacks") == 0) {
        printf("Hint: The 'callbacks' option is no longer necessary.\n");
      } else if( iter->first.compare("rtti") == 0) {
        rtti_ = true;
      } else if( iter->first.compare("buildmacro") == 0) {
        buildmacro_ = (iter->second);
      } else {
        throw "unknown option haxe:" + iter->first;
      }
    }

    out_dir_base_ = "gen-haxe";
  }